

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refzg.cc
# Opt level: O2

refzg_t * tchecker::refzg::factory
                    (shared_ptr<const_tchecker::ta::system_t> *system,sharing_type_t sharing_type,
                    reference_clock_variables_type_t refclocks_type,semantics_type_t semantics_type,
                    integer_t spread,size_t block_size,size_t table_size)

{
  system_t *system_00;
  semantics_t *__p;
  refzg_t *this;
  invalid_argument *this_00;
  shared_ptr<const_tchecker::reference_clock_variables_t> r;
  shared_ptr<tchecker::refzg::semantics_t> semantics;
  variable_access_map_t va_map;
  
  system_00 = (system->super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>)
              ._M_ptr;
  if (refclocks_type == PROCESS_REFERENCE_CLOCKS) {
    variable_access(&va_map,system_00);
    process_reference_clocks
              ((reference_clock_variables_t *)&semantics,&va_map,
               &(system_00->super_system_t).super_system_t.super_clocks_t._clock_variables.
                super_array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._flattened_variables,
               (process_id_t)
               (((long)*(pointer *)
                        ((long)&(system_00->super_system_t).super_system_t.super_processes_t.
                                _procs_attributes.
                                super__Vector_base<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>
                                ._M_impl.super__Vector_impl_data + 8) -
                (long)(system_00->super_system_t).super_system_t.super_processes_t._procs_attributes
                      .
                      super__Vector_base<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x38));
    std::
    make_shared<tchecker::reference_clock_variables_t_const,tchecker::reference_clock_variables_t>
              ((reference_clock_variables_t *)&r);
    reference_clock_variables_t::~reference_clock_variables_t
              ((reference_clock_variables_t *)&semantics);
    variable_access_map_t::~variable_access_map_t(&va_map);
  }
  else {
    if (refclocks_type != SINGLE_REFERENCE_CLOCKS) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Unknown reference clock variables type");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    single_reference_clocks
              ((reference_clock_variables_t *)&semantics,
               &(system_00->super_system_t).super_system_t.super_clocks_t._clock_variables.
                super_array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._flattened_variables,
               (process_id_t)
               (((long)*(pointer *)
                        ((long)&(system_00->super_system_t).super_system_t.super_processes_t.
                                _procs_attributes.
                                super__Vector_base<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>
                                ._M_impl.super__Vector_impl_data + 8) -
                (long)(system_00->super_system_t).super_system_t.super_processes_t._procs_attributes
                      .
                      super__Vector_base<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x38));
    std::
    make_shared<tchecker::reference_clock_variables_t_const,tchecker::reference_clock_variables_t>
              ((reference_clock_variables_t *)&r);
    reference_clock_variables_t::~reference_clock_variables_t
              ((reference_clock_variables_t *)&semantics);
  }
  __p = semantics_factory(semantics_type);
  std::__shared_ptr<tchecker::refzg::semantics_t,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::refzg::semantics_t,void>
            ((__shared_ptr<tchecker::refzg::semantics_t,(__gnu_cxx::_Lock_policy)2> *)&semantics,__p
            );
  this = (refzg_t *)operator_new(0x2f0);
  refzg_t::refzg_t(this,system,sharing_type,&r,&semantics,spread,block_size,table_size);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&semantics.super___shared_ptr<tchecker::refzg::semantics_t,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&r.
              super___shared_ptr<const_tchecker::reference_clock_variables_t,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return this;
}

Assistant:

tchecker::refzg::refzg_t * factory(std::shared_ptr<tchecker::ta::system_t const> const & system,
                                   enum tchecker::ts::sharing_type_t sharing_type,
                                   enum tchecker::refzg::reference_clock_variables_type_t refclocks_type,
                                   enum tchecker::refzg::semantics_type_t semantics_type, tchecker::integer_t spread,
                                   std::size_t block_size, std::size_t table_size)
{
  std::shared_ptr<tchecker::reference_clock_variables_t const> r(
      tchecker::refzg::reference_clocks_factory(refclocks_type, *system));
  std::shared_ptr<tchecker::refzg::semantics_t> semantics{tchecker::refzg::semantics_factory(semantics_type)};
  return new tchecker::refzg::refzg_t(system, sharing_type, r, semantics, spread, block_size, table_size);
}